

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O0

void __thiscall
BayesianGameCollaborativeGraphical::SanityCheckBGCG(BayesianGameCollaborativeGraphical *this)

{
  bool bVar1;
  const_reference ppBVar2;
  ostream *this_00;
  size_type in_RDI;
  Index e;
  BayesianGameCollaborativeGraphical *in_stack_00000070;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar3;
  
  for (uVar3 = 0; (ulong)uVar3 < *(ulong *)(in_RDI + 0xd8); uVar3 = uVar3 + 1) {
    ppBVar2 = std::
              vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
              ::at((vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
                    *)CONCAT44(uVar3,in_stack_fffffffffffffff0),in_RDI);
    (*((*ppBVar2)->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
      super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
      _vptr_Interface_ProblemToPolicyDiscrete[0xf])();
  }
  bVar1 = IsFullyConnected(in_stack_00000070);
  if (!bVar1) {
    this_00 = std::operator<<((ostream *)&std::cout,
                              "Warning: BayesianGameCollaborativeGraphical is not fully connected");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void BayesianGameCollaborativeGraphical::SanityCheckBGCG() const
{
    for(Index e=0; e < _m_nrLRFs; e++)
        _m_LRFs.at(e)->SanityCheck();

    if(!IsFullyConnected())
        cout << "Warning: BayesianGameCollaborativeGraphical is not fully connected"  << endl;
}